

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData>::
emplaceValue<QGuiApplicationPrivate::SynthesizedMouseData>
          (Node<QWindow_*,_QGuiApplicationPrivate::SynthesizedMouseData> *this,
          SynthesizedMouseData *args)

{
  Data *pDVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  uVar2 = *(undefined4 *)&(args->pos).xp;
  uVar3 = *(undefined4 *)((long)&(args->pos).xp + 4);
  uVar4 = *(undefined4 *)&(args->pos).yp;
  uVar5 = *(undefined4 *)((long)&(args->pos).yp + 4);
  uVar6 = *(undefined4 *)&(args->screenPos).xp;
  uVar7 = *(undefined4 *)((long)&(args->screenPos).xp + 4);
  uVar8 = *(undefined4 *)&(args->screenPos).yp;
  uVar9 = *(undefined4 *)((long)&(args->screenPos).yp + 4);
  uVar10 = *(undefined4 *)&(args->window).wp.d;
  uVar11 = *(undefined4 *)((long)&(args->window).wp.d + 4);
  uVar12 = *(undefined4 *)&(args->window).wp.value;
  uVar13 = *(undefined4 *)((long)&(args->window).wp.value + 4);
  (args->window).wp.d = (Data *)0x0;
  (args->window).wp.value = (QObject *)0x0;
  *(undefined4 *)&(this->value).screenPos.xp = uVar6;
  *(undefined4 *)((long)&(this->value).screenPos.xp + 4) = uVar7;
  *(undefined4 *)&(this->value).screenPos.yp = uVar8;
  *(undefined4 *)((long)&(this->value).screenPos.yp + 4) = uVar9;
  *(undefined4 *)&(this->value).pos.xp = uVar2;
  *(undefined4 *)((long)&(this->value).pos.xp + 4) = uVar3;
  *(undefined4 *)&(this->value).pos.yp = uVar4;
  *(undefined4 *)((long)&(this->value).pos.yp + 4) = uVar5;
  pDVar1 = (this->value).window.wp.d;
  *(undefined4 *)&(this->value).window.wp.d = uVar10;
  *(undefined4 *)((long)&(this->value).window.wp.d + 4) = uVar11;
  *(undefined4 *)&(this->value).window.wp.value = uVar12;
  *(undefined4 *)((long)&(this->value).window.wp.value + 4) = uVar13;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pDVar1);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }